

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O1

void __thiscall VcdGen::VcdGenerator::generate_module_info(VcdGenerator *this,Module *module)

{
  uint __val;
  pointer pcVar1;
  pointer ppSVar2;
  Signal *pSVar3;
  pointer ppMVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  undefined8 *puVar8;
  long *plVar9;
  pointer ppSVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  pointer ppMVar14;
  ulong uVar15;
  size_type *local_158;
  string __str;
  long local_128;
  long lStack_120;
  string *local_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  pcVar1 = (module->name_)._M_dataplus._M_p;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (module->name_)._M_string_length);
  puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1061b7);
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_40 = *plVar9;
    uStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*puVar8;
  }
  local_48 = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar12;
    local_90 = (long *)*plVar9;
  }
  local_88 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_118 = &this->vcd_data_;
  std::__cxx11::string::_M_append((char *)local_118,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  ppSVar10 = (module->signals_).
             super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar2 = (module->signals_).
            super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar10 != ppSVar2) {
    do {
      pSVar3 = *ppSVar10;
      __val = pSVar3->width_;
      cVar7 = '\x01';
      if (9 < __val) {
        uVar11 = __val;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (uVar11 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_001043d9;
          }
          if (uVar11 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_001043d9;
          }
          if (uVar11 < 10000) goto LAB_001043d9;
          bVar5 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar5);
        cVar7 = cVar7 + '\x01';
      }
LAB_001043d9:
      local_158 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_158,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_158,(uint)__str._M_dataplus._M_p,__val);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1061c6);
      __str.field_2._8_8_ = &local_128;
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_128 = *plVar12;
        lStack_120 = plVar9[3];
      }
      else {
        local_128 = *plVar12;
        __str.field_2._8_8_ = (long *)*plVar9;
      }
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar13) {
        local_100 = *puVar13;
        uStack_f8 = (undefined4)plVar9[3];
        uStack_f4 = *(undefined4 *)((long)plVar9 + 0x1c);
        local_110 = &local_100;
      }
      else {
        local_100 = *puVar13;
        local_110 = (ulong *)*plVar9;
      }
      local_108 = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_b0 = local_a0;
      pcVar1 = (pSVar3->encoded_name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + (pSVar3->encoded_name_)._M_string_length);
      uVar15 = 0xf;
      if (local_110 != &local_100) {
        uVar15 = local_100;
      }
      if (uVar15 < (ulong)(local_a8 + local_108)) {
        uVar15 = 0xf;
        if (local_b0 != local_a0) {
          uVar15 = local_a0[0];
        }
        if (uVar15 < (ulong)(local_a8 + local_108)) goto LAB_00104556;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
      }
      else {
LAB_00104556:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0);
      }
      plVar9 = puVar8 + 2;
      if ((long *)*puVar8 == plVar9) {
        local_e0 = *plVar9;
        uStack_d8 = puVar8[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar9;
        local_f0 = (long *)*puVar8;
      }
      local_e8 = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)plVar9 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_70 = &local_60;
      puVar13 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar13) {
        local_60 = *puVar13;
        uStack_58 = (undefined4)plVar9[3];
        uStack_54 = *(undefined4 *)((long)plVar9 + 0x1c);
      }
      else {
        local_60 = *puVar13;
        local_70 = (ulong *)*plVar9;
      }
      local_68 = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pcVar1 = (pSVar3->name_)._M_dataplus._M_p;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (pSVar3->name_)._M_string_length);
      uVar15 = 0xf;
      if (local_70 != &local_60) {
        uVar15 = local_60;
      }
      if (uVar15 < (ulong)(local_c8 + local_68)) {
        uVar15 = 0xf;
        if (local_d0 != local_c0) {
          uVar15 = local_c0[0];
        }
        if (uVar15 < (ulong)(local_c8 + local_68)) goto LAB_0010467c;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_0010467c:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0);
      }
      local_50 = &local_40;
      plVar9 = puVar8 + 2;
      if ((long *)*puVar8 == plVar9) {
        local_40 = *plVar9;
        uStack_38 = puVar8[3];
      }
      else {
        local_40 = *plVar9;
        local_50 = (long *)*puVar8;
      }
      local_48 = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)plVar9 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_80 = *plVar12;
        lStack_78 = plVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar12;
        local_90 = (long *)*plVar9;
      }
      local_88 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_118,(ulong)local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((long *)__str.field_2._8_8_ != &local_128) {
        operator_delete((void *)__str.field_2._8_8_,local_128 + 1);
      }
      if (local_158 != &__str._M_string_length) {
        operator_delete(local_158,__str._M_string_length + 1);
      }
      ppSVar10 = ppSVar10 + 1;
    } while (ppSVar10 != ppSVar2);
  }
  ppMVar4 = (module->sub_modules_).
            super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar14 = (module->sub_modules_).
                  super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar14 != ppMVar4; ppMVar14 = ppMVar14 + 1) {
    generate_module_info(this,*ppMVar14);
  }
  std::__cxx11::string::append((char *)local_118);
  return;
}

Assistant:

void generate_module_info(Module* module){
        vcd_data_ += "$scope module " + module->get_name() + " $end\n";
        for( auto signal : module->get_signals() ){
            vcd_data_ += "$var wire " + to_string(signal->get_width()) + " " + 
                         signal->get_encoded_name() + " " + signal->get_name() + 
                         " $end\n";
        }

        //if( module->get_num_submodules() > 0){
        //    vector<Module*> &sub_mods = module->get_submodules();
        //    Module* m = sub_mods[0];
        //    sub_mods.erase(sub_mods.begin());
        //    generate_module_info(m);
        //}

        for( auto m : module->get_submodules() ){
            generate_module_info(m);
        } 
        
        vcd_data_ += "$upscope $end\n";
    }